

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void amrex::CreateDirectoryFailed(string *dir)

{
  string msg;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"Couldn\'t create directory: ","");
  std::__cxx11::string::_M_append((char *)local_38,(ulong)(dir->_M_dataplus)._M_p);
  Error_host((char *)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void
amrex::CreateDirectoryFailed (const std::string& dir)
{
    std::string msg("Couldn't create directory: ");
    msg += dir;
    amrex::Error(msg.c_str());
}